

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

Var Js::Math::Max(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Var pvVar6;
  uint uVar7;
  CallInfo scriptContext_00;
  ulong uVar8;
  uint idxArg;
  Type ppvVar9;
  int in_stack_00000010;
  CallInfo local_58;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != local_58._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,699,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00d417a5;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])local_58;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_48,&local_58);
  if (((ulong)local_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,700,"(args.Info.Count > 0)","Should always have implicit \'this\'")
    ;
    if (!bVar2) goto LAB_00d417a5;
    *puVar4 = 0;
  }
  scriptContext_00 =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_58 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x2c0,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00d417a5;
    *puVar4 = 0;
  }
  uVar7 = local_48._0_4_ & 0xffffff;
  if (uVar7 < 2) {
    return (((ScriptContextBase *)((long)scriptContext_00 + 8))->javascriptLibrary->
           super_JavascriptLibraryBase).negativeInfinite.ptr;
  }
  if (uVar7 == 2) {
    pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00d417a5;
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      ppvVar9 = (Type)(double)(int)pvVar5;
    }
    else if ((ulong)pvVar5 >> 0x32 == 0) {
      ppvVar9 = (Type)JavascriptConversion::ToNumber_Full(pvVar5,(ScriptContext *)scriptContext_00);
    }
    else {
      ppvVar9 = (Type)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
  }
  else {
    bVar2 = ((ulong)local_48 & 0xfffffe) == 0;
    callInfo_local = scriptContext_00;
    if (!bVar2) {
      uVar7 = 1;
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      bVar2 = false;
      do {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,uVar7);
        if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) break;
        uVar7 = uVar7 + 1;
        bVar3 = uVar7 < (local_48._0_4_ & 0xffffff);
        bVar2 = !bVar3;
      } while (bVar3);
    }
    if (bVar2) {
      if ((local_48._0_4_ & 0xffffff) == 3) {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
        if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        pvVar6 = Arguments::operator[]((Arguments *)local_48,2);
        if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if ((int)pvVar6 < (int)pvVar5) {
          pvVar6 = pvVar5;
        }
        uVar8 = (ulong)pvVar6 & 0xffffffff;
LAB_00d41786:
        return (Var)(uVar8 | 0x1000000000000);
      }
      if (bVar2) {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
        if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar2) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if ((local_48._0_4_ & 0xffffff) < 3) {
          uVar7 = (uint)pvVar5;
        }
        else {
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          idxArg = 2;
          do {
            pvVar6 = Arguments::operator[]((Arguments *)local_48,idxArg);
            if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
                ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar2) goto LAB_00d417a5;
              *puVar4 = 0;
            }
            if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x43,"(Is(aValue))",
                                          "Ensure var is actually a \'TaggedInt\'");
              if (!bVar2) goto LAB_00d417a5;
              *puVar4 = 0;
            }
            if ((int)pvVar6 < (int)pvVar5) {
              pvVar6 = pvVar5;
            }
            uVar7 = (uint)pvVar6;
            idxArg = idxArg + 1;
            pvVar5 = (Var)((ulong)pvVar6 & 0xffffffff);
          } while (idxArg < (local_48._0_4_ & 0xffffff));
        }
        uVar8 = (ulong)uVar7;
        goto LAB_00d41786;
      }
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00d417a5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      args.super_Arguments.Values = (Type)(double)(int)pvVar5;
    }
    else if ((ulong)pvVar5 >> 0x32 == 0) {
      args.super_Arguments.Values =
           (Type)JavascriptConversion::ToNumber_Full(pvVar5,(ScriptContext *)callInfo_local);
    }
    else {
      args.super_Arguments.Values = (Type)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
    bVar2 = NumberUtilities::IsNan((double)args.super_Arguments.Values);
    if (2 < (local_48._0_4_ & 0xffffff)) {
      uVar7 = 2;
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,uVar7);
        if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00d417a5;
          *puVar4 = 0;
        }
        if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
          ppvVar9 = (Type)(double)(int)pvVar5;
        }
        else if (pvVar5 < (Var)0x4000000000000) {
          ppvVar9 = (Type)JavascriptConversion::ToNumber_Full
                                    (pvVar5,(ScriptContext *)callInfo_local);
        }
        else {
          ppvVar9 = (Type)((ulong)pvVar5 ^ 0xfffc000000000000);
        }
        bVar3 = NumberUtilities::IsNan((double)ppvVar9);
        if (bVar3) {
          bVar2 = true;
        }
        else if (bVar2 == false) {
          if (((((double)ppvVar9 == 0.0) && (!NAN((double)ppvVar9))) &&
              (bVar3 = NumberUtilities::IsSpecial
                                 ((double)args.super_Arguments.Values,0x8000000000000000), bVar3))
             || ((double)args.super_Arguments.Values < (double)ppvVar9)) {
            args.super_Arguments.Values = ppvVar9;
          }
        }
        else {
          bVar2 = true;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (local_48._0_4_ & 0xffffff));
    }
    scriptContext_00 = callInfo_local;
    ppvVar9 = args.super_Arguments.Values;
    if (bVar2 != false) {
      return *(Var *)(*(long *)((long)callInfo_local + 8) + 0x3f8);
    }
  }
  pvVar5 = JavascriptNumber::ToVarNoCheck((double)ppvVar9,(ScriptContext *)scriptContext_00);
  return pvVar5;
}

Assistant:

Var Math::Max(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();
        bool hasOnlyIntegerArgs = false;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetNegativeInfinite();
        }
        else if (args.Info.Count == 2)
        {
            double result = JavascriptConversion::ToNumber(args[1], scriptContext);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            hasOnlyIntegerArgs = TaggedInt::OnlyContainsTaggedInt(args);
            if (hasOnlyIntegerArgs && args.Info.Count == 3)
            {
                return TaggedInt::ToVarUnchecked(max(TaggedInt::ToInt32(args[1]), TaggedInt::ToInt32(args[2])));
            }
        }

        if (hasOnlyIntegerArgs)
        {
            int32 current = TaggedInt::ToInt32(args[1]);
            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                int32 compare = TaggedInt::ToInt32(args[idxArg]);
                if (current < compare)
                {
                    current = compare;
                }
            }

            return TaggedInt::ToVarUnchecked(current);
        }
        else
        {
            double current = JavascriptConversion::ToNumber(args[1], scriptContext);

            bool returnNaN = false;
            if (JavascriptNumber::IsNan(current))
            {
                returnNaN = true;
            }

            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                double compare = JavascriptConversion::ToNumber(args[idxArg], scriptContext);
                if (JavascriptNumber::IsNan(compare) || returnNaN) // Call ToNumber for all args
                {
                    returnNaN = true;
                }

                // In C++, -0.0f == 0.0f; however, in ES, -0.0f < 0.0f. Thus, use additional library 
                // call to test this comparison.
                else if ((compare == 0 && JavascriptNumber::IsNegZero(current)) ||
                    current < compare)
                {
                    current = compare;
                }
            }

            if (returnNaN)
            {
                return scriptContext->GetLibrary()->GetNaN();
            }

            return JavascriptNumber::ToVarNoCheck(current, scriptContext);
        }
    }